

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_colorspace_check_gamma
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_fixed_point gAMA,int from)

{
  int iVar1;
  png_fixed_point local_2c;
  int local_28;
  png_fixed_point gtest;
  int from_local;
  png_fixed_point gAMA_local;
  png_colorspacerp colorspace_local;
  png_const_structrp png_ptr_local;
  
  if ((colorspace->flags & 1) == 0) {
LAB_004084e2:
    png_ptr_local._4_4_ = 1;
  }
  else {
    local_28 = from;
    gtest = gAMA;
    _from_local = colorspace;
    colorspace_local = (png_colorspacerp)png_ptr;
    iVar1 = png_muldiv(&local_2c,colorspace->gamma,100000,gAMA);
    if (iVar1 != 0) {
      iVar1 = png_gamma_significant(local_2c);
      if (iVar1 == 0) goto LAB_004084e2;
    }
    if (((_from_local->flags & 0x20) == 0) && (local_28 != 2)) {
      png_chunk_report((png_const_structrp)colorspace_local,
                       "gamma value does not match libpng estimate",0);
      png_ptr_local._4_4_ = (uint)(local_28 == 1);
    }
    else {
      png_chunk_report((png_const_structrp)colorspace_local,"gamma value does not match sRGB",2);
      png_ptr_local._4_4_ = (uint)(local_28 == 2);
    }
  }
  return png_ptr_local._4_4_;
}

Assistant:

static int
png_colorspace_check_gamma(png_const_structrp png_ptr,
    png_colorspacerp colorspace, png_fixed_point gAMA, int from)
   /* This is called to check a new gamma value against an existing one.  The
    * routine returns false if the new gamma value should not be written.
    *
    * 'from' says where the new gamma value comes from:
    *
    *    0: the new gamma value is the libpng estimate for an ICC profile
    *    1: the new gamma value comes from a gAMA chunk
    *    2: the new gamma value comes from an sRGB chunk
    */
{
   png_fixed_point gtest;

   if ((colorspace->flags & PNG_COLORSPACE_HAVE_GAMMA) != 0 &&
       (png_muldiv(&gtest, colorspace->gamma, PNG_FP_1, gAMA) == 0  ||
      png_gamma_significant(gtest) != 0))
   {
      /* Either this is an sRGB image, in which case the calculated gamma
       * approximation should match, or this is an image with a profile and the
       * value libpng calculates for the gamma of the profile does not match the
       * value recorded in the file.  The former, sRGB, case is an error, the
       * latter is just a warning.
       */
      if ((colorspace->flags & PNG_COLORSPACE_FROM_sRGB) != 0 || from == 2)
      {
         png_chunk_report(png_ptr, "gamma value does not match sRGB",
             PNG_CHUNK_ERROR);
         /* Do not overwrite an sRGB value */
         return from == 2;
      }

      else /* sRGB tag not involved */
      {
         png_chunk_report(png_ptr, "gamma value does not match libpng estimate",
             PNG_CHUNK_WARNING);
         return from == 1;
      }
   }

   return 1;
}